

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,SignParameter *sign_parameter)

{
  ScriptOperator local_60;
  
  cfd::core::ByteData::ByteData(&this->data_);
  cfd::core::Pubkey::Pubkey(&this->related_pubkey_);
  cfd::core::SigHashType::SigHashType(&this->sighash_type_);
  core::ScriptOperator::ScriptOperator(&this->op_code_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)sign_parameter);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  this->data_type_ = sign_parameter->data_type_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sign_parameter->related_pubkey_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->related_pubkey_,
             &local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  this->der_encode_ = sign_parameter->der_encode_;
  cfd::core::SigHashType::SigHashType((SigHashType *)&local_60,&sign_parameter->sighash_type_);
  cfd::core::SigHashType::operator=(&this->sighash_type_,(SigHashType *)&local_60);
  cfd::core::ScriptOperator::ScriptOperator(&local_60,&sign_parameter->op_code_);
  cfd::core::ScriptOperator::operator=(&this->op_code_,&local_60);
  core::ScriptOperator::~ScriptOperator(&local_60);
  return;
}

Assistant:

SignParameter::SignParameter(const SignParameter& sign_parameter) {
  data_ = sign_parameter.GetData();
  data_type_ = sign_parameter.GetDataType();
  related_pubkey_ = sign_parameter.GetRelatedPubkey();
  der_encode_ = sign_parameter.IsDerEncode();
  sighash_type_ = sign_parameter.GetSigHashType();
  op_code_ = sign_parameter.GetOpCode();
}